

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O3

void anon_unknown.dwarf_234a9a::testWriteRead
               (int partNumber,int runCount,int randomReadCount,string *tempDir)

{
  ulong *puVar1;
  ulong *puVar2;
  float fVar3;
  pointer pcVar4;
  ulong uVar5;
  FrameBuffer *pFVar6;
  size_type sVar7;
  size_t sVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 uVar11;
  Header *pHVar12;
  Header *pHVar13;
  char cVar14;
  bool bVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  undefined4 uVar19;
  int width;
  int iVar20;
  int iVar21;
  int iVar22;
  ostream *poVar23;
  char *pcVar24;
  TileDescription *pTVar25;
  long lVar26;
  TiledOutputPart *pTVar27;
  ulong uVar28;
  ulong *puVar29;
  OutputPart *this;
  ThreadPool *pTVar30;
  Task *__dest;
  pointer __dest_00;
  pointer __dest_01;
  undefined8 *puVar31;
  undefined8 *puVar32;
  float *pfVar33;
  float *pfVar34;
  int *piVar35;
  ChannelList *this_00;
  ChannelList *pCVar36;
  void *pvVar37;
  ulong uVar38;
  long lVar39;
  ulong *puVar40;
  Header *this_01;
  size_type sVar41;
  ulong uVar42;
  Task *pTVar43;
  _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  *this_02;
  uint uVar44;
  uint uVar45;
  int iVar46;
  Task *pTVar47;
  Task *pTVar48;
  TaskGroup *__n;
  size_type *psVar49;
  long *plVar50;
  WritingTaskData *pWVar51;
  Task *pTVar52;
  size_type *psVar53;
  int iVar54;
  ulong uVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  int *numYTiles;
  MultiPartOutputFile file;
  Array2D<unsigned_int> uintData;
  int numYLevel;
  int numXLevel;
  Array<Imf_3_4::Array2D<Imf_3_4::FrameBuffer>_> tiledFrameBuffers;
  Array2D<float> floatData;
  Array2D<Imath_3_2::half> halfData;
  vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> frameBuffers;
  string fn;
  vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
  taskList;
  vector<void_*,_std::allocator<void_*>_> parts;
  TiledOutputPart *local_370;
  Task *local_368;
  uint local_35c;
  Array2D<unsigned_int> local_358;
  ulong local_330;
  Array2D<unsigned_int> local_328;
  ulong local_308;
  Array2D<Imf_3_4::FrameBuffer> *local_300;
  size_t local_2f8;
  ThreadPool *local_2f0;
  ulong local_2e8;
  int local_2e0;
  int local_2dc;
  Array<Imf_3_4::Array2D<Imf_3_4::FrameBuffer>_> local_2d8;
  Array2D<Imath_3_2::half> local_2c8;
  Array2D<Imath_3_2::half> local_2a8;
  vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> local_288;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_270;
  ulong local_250;
  long *local_248 [2];
  long local_238 [2];
  int local_224;
  int local_220;
  int local_21c;
  void *local_218;
  long lStack_210;
  long local_208;
  size_type *local_1f8;
  size_type *local_1f0;
  size_type *local_1e8;
  size_type *local_1e0;
  size_type *local_1d8;
  size_type *local_1d0;
  size_t local_1c8;
  ulong local_1c0;
  undefined1 local_1b8 [8];
  undefined8 uStack_1b0;
  _Base_ptr local_1a8;
  _Base_ptr local_1a0;
  _Base_ptr local_198;
  size_t local_190;
  ios_base local_138 [264];
  
  local_220 = randomReadCount;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing file with ",0x12);
  local_35c = partNumber;
  poVar23 = (ostream *)std::ostream::operator<<(&std::cout,partNumber);
  std::__ostream_insert<char,std::char_traits<char>>(poVar23," part(s).",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
  std::ostream::put((char)poVar23);
  std::ostream::flush();
  std::ostream::flush();
  local_248[0] = local_238;
  pcVar4 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_248,pcVar4,pcVar4 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)local_248);
  local_224 = runCount;
  if (0 < runCount) {
    local_308 = (ulong)local_35c;
    local_1c0 = local_308 * 0x18 + 8;
    local_1c8 = ((local_308 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18;
    iVar16 = 0;
    do {
      local_2a8._sizeX = 0;
      local_2a8._sizeY = 0;
      local_2a8._data = (half *)0x0;
      local_2c8._data = (half *)0x0;
      local_2c8._sizeX = 0;
      local_2c8._sizeY = 0;
      local_328._data = (uint *)0x0;
      local_328._sizeX = 0;
      local_328._sizeY = 0;
      local_21c = iVar16;
      fillPixels<unsigned_int>(&local_328,0xc5,0x107);
      fillPixels<Imath_3_2::half>(&local_2a8,0xc5,0x107);
      fillPixels<float>((Array2D<float> *)&local_2c8,0xc5,0x107);
      uVar28 = local_1c0;
      local_1e8 = (size_type *)operator_new__(local_1c0);
      sVar8 = local_1c8;
      uVar38 = local_308;
      *local_1e8 = local_308;
      local_1e0 = local_1e8 + 1;
      memset(local_1e0,0,local_1c8);
      local_1f0 = (size_type *)operator_new__(uVar28);
      *local_1f0 = uVar38;
      local_1d8 = local_1f0 + 1;
      memset(local_1d8,0,sVar8);
      local_1f8 = (size_type *)operator_new__(uVar28);
      *local_1f8 = uVar38;
      local_1d0 = local_1f8 + 1;
      memset(local_1d0,0,sVar8);
      local_218 = (void *)0x0;
      lStack_210 = 0;
      local_208 = 0;
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::pixelTypes,uVar38);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::partTypes,local_308);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::levelModes,local_308);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Generating headers and data ",0x1c);
      std::ostream::flush();
      pHVar13 = DAT_001ebd30;
      pHVar12 = (anonymous_namespace)::headers;
      this_01 = (anonymous_namespace)::headers;
      if (DAT_001ebd30 != (anonymous_namespace)::headers) {
        do {
          Imf_3_4::Header::~Header(this_01);
          this_01 = this_01 + 0x38;
        } while (this_01 != pHVar13);
        DAT_001ebd30 = pHVar12;
      }
      if (0 < (int)local_35c) {
        sVar41 = 0;
        do {
          local_1b8 = (undefined1  [8])0x0;
          Imf_3_4::Header::Header
                    ((Header *)&local_288,0xc5,0x107,1.0,(Vec2 *)local_1b8,1.0,INCREASING_Y,
                     ZIP_COMPRESSION);
          iVar16 = random_int(3);
          iVar17 = random_int(2);
          *(int *)((anonymous_namespace)::pixelTypes + sVar41 * 4) = iVar16;
          *(int *)((anonymous_namespace)::partTypes + sVar41 * 4) = iVar17;
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          iVar18 = (int)sVar41;
          std::ostream::operator<<(&local_1a8,iVar18);
          std::__cxx11::stringbuf::str();
          Imf_3_4::Header::setName((string *)&local_288);
          if ((uint **)local_358._sizeX != &local_358._data) {
            operator_delete((void *)local_358._sizeX,(long)local_358._data + 1);
          }
          if (iVar16 == 0) {
            pcVar24 = (char *)Imf_3_4::Header::channels();
            Imf_3_4::Channel::Channel((Channel *)&local_358,UINT,1,1,false);
            Imf_3_4::ChannelList::insert(pcVar24,(Channel *)"UINT");
          }
          else if (iVar16 == 1) {
            pcVar24 = (char *)Imf_3_4::Header::channels();
            Imf_3_4::Channel::Channel((Channel *)&local_358,FLOAT,1,1,false);
            Imf_3_4::ChannelList::insert(pcVar24,(Channel *)"FLOAT");
          }
          else if (iVar16 == 2) {
            pcVar24 = (char *)Imf_3_4::Header::channels();
            Imf_3_4::Channel::Channel((Channel *)&local_358,HALF,1,1,false);
            Imf_3_4::ChannelList::insert(pcVar24,(Channel *)"HALF");
          }
          if (iVar17 == 1) {
            Imf_3_4::Header::setType((string *)&local_288);
            iVar16 = random_int(0xc5);
            iVar17 = random_int(0x107);
            uVar45 = random_int(3);
            *(uint *)((anonymous_namespace)::levelModes + sVar41 * 4) = uVar45;
            uVar44 = 3;
            if (uVar45 < 3) {
              uVar44 = uVar45;
            }
            local_358._sizeX = CONCAT44(iVar17 + 1,iVar16 + 1);
            local_358._sizeY = (long)uVar44;
            Imf_3_4::Header::setTileDescription((TileDescription *)&local_288);
            bVar15 = uVar45 != 1;
LAB_0017efd1:
            pTVar25 = (TileDescription *)Imf_3_4::Header::tileDescription();
            Imf_3_4::precalculateTileInfo
                      (pTVar25,0,0xc4,0,0x106,(int **)&local_2d8,(int **)&local_370,&local_2dc,
                       &local_2e0);
            if (0 < local_2dc) {
              lVar26 = 0;
              iVar16 = local_2dc;
              iVar17 = local_2e0;
              do {
                if (0 < iVar17) {
                  lVar39 = 0;
                  do {
                    if ((!(bool)(~bVar15 & lVar26 != lVar39)) &&
                       (0 < *(int *)(local_2d8._size + lVar26 * 4))) {
                      iVar16 = 0;
                      pTVar27 = local_370;
                      pvVar37 = (void *)local_2d8._size;
                      do {
                        if (0 < *(int *)(pTVar27 + lVar39 * 4)) {
                          iVar17 = 0;
                          do {
                            local_358._sizeX = CONCAT44(iVar16,iVar18);
                            local_358._sizeY = CONCAT44((int)lVar26,iVar17);
                            local_358._data = (uint *)CONCAT44(local_358._data._4_4_,(int)lVar39);
                            std::
                            vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                            ::push_back((vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                                         *)&local_218,(value_type *)&local_358);
                            iVar17 = iVar17 + 1;
                            pTVar27 = local_370;
                            pvVar37 = (void *)local_2d8._size;
                          } while (iVar17 < *(int *)(local_370 + lVar39 * 4));
                        }
                        iVar16 = iVar16 + 1;
                        iVar17 = local_2e0;
                      } while (iVar16 < *(int *)((long)pvVar37 + lVar26 * 4));
                    }
                    lVar39 = lVar39 + 1;
                    iVar16 = local_2dc;
                  } while (lVar39 < iVar17);
                }
                lVar26 = lVar26 + 1;
              } while (lVar26 < iVar16);
            }
            if ((void *)local_2d8._size != (void *)0x0) {
              operator_delete__((void *)local_2d8._size);
            }
            if (local_370 != (TiledOutputPart *)0x0) {
              operator_delete__(local_370);
            }
          }
          else {
            bVar15 = true;
            if (iVar17 != 0) goto LAB_0017efd1;
            Imf_3_4::Header::setType((string *)&local_288);
            iVar16 = 0x107;
            do {
              local_358._sizeX = CONCAT44(local_358._sizeX._4_4_,iVar18);
              std::
              vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
              ::push_back((vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                           *)&local_218,(value_type *)&local_358);
              iVar16 = iVar16 + -1;
            } while (iVar16 != 0);
          }
          std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
                    ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
                     &(anonymous_namespace)::headers,(value_type *)&local_288);
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
          Imf_3_4::Header::~Header((Header *)&local_288);
          sVar41 = sVar41 + 1;
        } while (sVar41 != local_308);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Shuffling ",10);
      pvVar37 = local_218;
      uVar38 = (lStack_210 - (long)local_218 >> 2) * -0x3333333333333333;
      poVar23 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar23," tasks ",7);
      std::ostream::flush();
      iVar16 = (int)uVar38;
      uVar28 = uVar38 & 0xffffffff;
      if (0 < iVar16) {
        do {
          iVar17 = random_int(iVar16);
          iVar18 = random_int(iVar16);
          lVar39 = (long)iVar17;
          lVar26 = (long)iVar18;
          uVar19 = *(undefined4 *)((long)pvVar37 + lVar39 * 0x14 + 0x10);
          local_1a8 = (_Base_ptr)CONCAT44(local_1a8._4_4_,uVar19);
          puVar29 = (ulong *)((long)pvVar37 + lVar39 * 0x14);
          local_1b8 = (undefined1  [8])*puVar29;
          uStack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar29[1];
          *(undefined4 *)((long)pvVar37 + lVar39 * 0x14 + 0x10) =
               *(undefined4 *)((long)pvVar37 + lVar26 * 0x14 + 0x10);
          puVar31 = (undefined8 *)((long)pvVar37 + lVar26 * 0x14);
          uVar11 = puVar31[1];
          puVar32 = (undefined8 *)((long)pvVar37 + lVar39 * 0x14);
          *puVar32 = *puVar31;
          puVar32[1] = uVar11;
          *(undefined4 *)((long)pvVar37 + lVar26 * 0x14 + 0x10) = uVar19;
          puVar29 = (ulong *)((long)pvVar37 + lVar26 * 0x14);
          *puVar29 = (ulong)local_1b8;
          puVar29[1] = (ulong)uStack_1b0;
          uVar44 = (int)uVar28 - 1;
          uVar28 = (ulong)uVar44;
        } while (uVar44 != 0);
      }
      local_250 = uVar38;
      remove((char *)local_248[0]);
      plVar50 = local_248[0];
      pHVar13 = DAT_001ebd30;
      pHVar12 = (anonymous_namespace)::headers;
      iVar16 = Imf_3_4::globalThreadCount();
      Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
                ((MultiPartOutputFile *)&local_358,(char *)plVar50,pHVar12,
                 (int)((ulong)((long)pHVar13 - (long)pHVar12) >> 3) * -0x49249249,false,iVar16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Writing tasks ",0xe)
      ;
      std::ostream::flush();
      uVar38 = local_308;
      local_1b8 = (undefined1  [8])0x0;
      uStack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1a8 = (_Base_ptr)0x0;
      std::vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>::vector
                (&local_288,local_308,(allocator_type *)&local_2d8);
      Imf_3_4::Array<Imf_3_4::Array2D<Imf_3_4::FrameBuffer>_>::Array(&local_2d8,uVar38);
      if (0 < (int)local_35c) {
        uVar38 = 0;
        do {
          if (*(int *)((anonymous_namespace)::partTypes + uVar38 * 4) == 0) {
            this = (OutputPart *)operator_new(8);
            Imf_3_4::OutputPart::OutputPart(this,(MultiPartOutputFile *)&local_358,(int)uVar38);
            local_370 = (TiledOutputPart *)this;
            std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                      ((vector<void*,std::allocator<void*>> *)local_1b8,&local_370);
            setOutputFrameBuffer
                      (local_288.
                       super__Vector_base<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar38,
                       *(int *)((anonymous_namespace)::pixelTypes + uVar38 * 4),
                       (Array2D<unsigned_int> *)local_328._data,(Array2D<float> *)local_2c8._data,
                       (Array2D<Imath_3_2::half> *)local_2a8._data,0xc5);
            Imf_3_4::OutputPart::setFrameBuffer((FrameBuffer *)this);
          }
          else {
            pTVar27 = (TiledOutputPart *)operator_new(8);
            Imf_3_4::TiledOutputPart::TiledOutputPart
                      (pTVar27,(MultiPartOutputFile *)&local_358,(int)uVar38);
            local_370 = pTVar27;
            std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                      ((vector<void*,std::allocator<void*>> *)local_1b8,&local_370);
            uVar19 = Imf_3_4::TiledOutputPart::numXLevels();
            local_2f0 = (ThreadPool *)CONCAT44(local_2f0._4_4_,uVar19);
            iVar16 = Imf_3_4::TiledOutputPart::numYLevels();
            local_2e8 = CONCAT44(local_2e8._4_4_,iVar16);
            local_330 = (ulong)iVar16;
            iVar16 = (int)local_2f0;
            uVar28 = (ulong)(int)local_2f0;
            uVar42 = local_330 * uVar28;
            auVar9._8_8_ = 0;
            auVar9._0_8_ = uVar42;
            local_368 = SUB168(auVar9 * ZEXT816(0x18),0);
            uVar55 = (long)local_368 + 8;
            if (0xfffffffffffffff7 < local_368) {
              uVar55 = 0xffffffffffffffff;
            }
            if (SUB168(auVar9 * ZEXT816(0x18),8) != 0) {
              uVar55 = 0xffffffffffffffff;
            }
            puVar29 = (ulong *)operator_new__(uVar55);
            *puVar29 = uVar42;
            if (uVar42 != 0) {
              memset(puVar29 + 1,0,(((long)local_368 - 0x18U) / 0x18) * 0x18 + 0x18);
            }
            local_300 = (Array2D<Imf_3_4::FrameBuffer> *)(uVar38 * 3);
            puVar1 = local_1d0 + uVar38 * 3;
            uVar5 = puVar1[2];
            if (uVar5 != 0) {
              lVar26 = *(long *)(uVar5 - 8);
              if (lVar26 != 0) {
                lVar39 = lVar26 * 0x18;
                do {
                  pvVar37 = *(void **)((long)(uVar5 - 8) + lVar39);
                  if (pvVar37 != (void *)0x0) {
                    operator_delete__(pvVar37);
                  }
                  lVar39 = lVar39 + -0x18;
                } while (lVar39 != 0);
              }
              operator_delete__((void *)(uVar5 - 8),lVar26 * 0x18 + 8);
            }
            *puVar1 = local_330;
            puVar1[1] = uVar28;
            puVar1[2] = (ulong)(puVar29 + 1);
            puVar29 = (ulong *)operator_new__(uVar55);
            *puVar29 = uVar42;
            if (uVar42 != 0) {
              memset(puVar29 + 1,0,(((long)local_368 - 0x18U) / 0x18) * 0x18 + 0x18);
            }
            puVar2 = local_1d8 + (long)local_300;
            uVar5 = puVar2[2];
            if (uVar5 != 0) {
              local_2f8 = *(size_t *)(uVar5 - 8);
              if (local_2f8 != 0) {
                lVar26 = local_2f8 * 0x18;
                do {
                  pvVar37 = *(void **)((long)(uVar5 - 8) + lVar26);
                  if (pvVar37 != (void *)0x0) {
                    operator_delete__(pvVar37);
                  }
                  lVar26 = lVar26 + -0x18;
                } while (lVar26 != 0);
              }
              operator_delete__((void *)(uVar5 - 8),local_2f8 * 0x18 + 8);
            }
            *puVar2 = local_330;
            puVar2[1] = uVar28;
            puVar2[2] = (ulong)(puVar29 + 1);
            puVar29 = (ulong *)operator_new__(uVar55);
            *puVar29 = uVar42;
            if (uVar42 != 0) {
              memset(puVar29 + 1,0,(((long)local_368 - 0x18U) / 0x18) * 0x18 + 0x18);
            }
            local_368 = (Task *)(local_1e0 + (long)local_300);
            uVar55 = *(ulong *)(local_368 + 0x10);
            if (uVar55 != 0) {
              lVar26 = *(long *)(uVar55 - 8);
              if (lVar26 != 0) {
                lVar39 = lVar26 * 0x18;
                do {
                  pvVar37 = *(void **)((long)(uVar55 - 8) + lVar39);
                  if (pvVar37 != (void *)0x0) {
                    operator_delete__(pvVar37);
                  }
                  lVar39 = lVar39 + -0x18;
                } while (lVar39 != 0);
              }
              operator_delete__((void *)(uVar55 - 8),lVar26 * 0x18 + 8);
            }
            auVar10._8_8_ = 0;
            auVar10._0_8_ = uVar42;
            uVar55 = SUB168(auVar10 * ZEXT816(0x30),0) | 8;
            *(ulong *)local_368 = local_330;
            *(ulong *)(local_368 + 8) = uVar28;
            if (SUB168(auVar10 * ZEXT816(0x30),8) != 0) {
              uVar55 = 0xffffffffffffffff;
            }
            *(ulong **)(local_368 + 0x10) = puVar29 + 1;
            plVar50 = &(local_2d8._data)->_sizeX + (long)local_300;
            puVar29 = (ulong *)operator_new__(uVar55);
            *puVar29 = uVar42;
            if (uVar42 != 0) {
              lVar26 = uVar42 * 0x30;
              puVar40 = puVar29 + 2;
              do {
                *(undefined4 *)puVar40 = 0;
                puVar40[1] = 0;
                puVar40[2] = (ulong)puVar40;
                puVar40[3] = (ulong)puVar40;
                puVar40[4] = 0;
                puVar40 = puVar40 + 6;
                lVar26 = lVar26 + -0x30;
              } while (lVar26 != 0);
            }
            pFVar6 = (FrameBuffer *)plVar50[2];
            if (pFVar6 != (FrameBuffer *)0x0) {
              local_2f8 = pFVar6[-1]._map._M_t._M_impl.super__Rb_tree_header._M_node_count;
              if (local_2f8 != 0) {
                lVar26 = local_2f8 * 0x30;
                do {
                  std::
                  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                               *)(&pFVar6[-1]._map._M_t._M_impl.field_0x0 + lVar26));
                  lVar26 = lVar26 + -0x30;
                } while (lVar26 != 0);
              }
              operator_delete__(&pFVar6[-1]._map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                local_2f8 * 0x30 + 8);
            }
            *plVar50 = local_330;
            plVar50[1] = uVar28;
            plVar50[2] = (long)(puVar29 + 1);
            if (0 < iVar16) {
              local_330 = (ulong)local_2f0 & 0xffffffff;
              uVar28 = local_2e8 & 0xffffffff;
              uVar42 = 0;
              do {
                if (0 < (int)local_2e8) {
                  uVar55 = 0;
                  do {
                    iVar16 = (int)pTVar27;
                    cVar14 = Imf_3_4::TiledOutputPart::isValidLevel(iVar16,(int)uVar42);
                    if (cVar14 != '\0') {
                      iVar17 = Imf_3_4::TiledOutputPart::levelWidth(iVar16);
                      iVar18 = Imf_3_4::TiledOutputPart::levelHeight(iVar16);
                      lVar26 = (&(local_2d8._data)->_sizeY)[(long)local_300];
                      pFVar6 = (&(local_2d8._data)->_data)[(long)local_300];
                      iVar16 = *(int *)((anonymous_namespace)::pixelTypes + uVar38 * 4);
                      if (iVar16 == 0) {
                        fillPixels<unsigned_int>
                                  ((Array2D<unsigned_int> *)
                                   (puVar1[1] * uVar55 * 0x18 + puVar1[2] + uVar42 * 0x18),iVar17,
                                   iVar18);
                      }
                      else if (iVar16 == 1) {
                        fillPixels<float>((Array2D<float> *)
                                          (puVar2[1] * uVar55 * 0x18 + puVar2[2] + uVar42 * 0x18),
                                          iVar17,iVar18);
                      }
                      else if (iVar16 == 2) {
                        fillPixels<Imath_3_2::half>
                                  ((Array2D<Imath_3_2::half> *)
                                   (*(ulong *)(local_368 + 8) * uVar55 * 0x18 +
                                    *(ulong *)(local_368 + 0x10) + uVar42 * 0x18),iVar17,iVar18);
                      }
                      lVar39 = uVar42 * 0x18;
                      setOutputFrameBuffer
                                (pFVar6 + lVar26 * uVar55 + uVar42,
                                 *(int *)((anonymous_namespace)::pixelTypes + uVar38 * 4),
                                 *(Array2D<unsigned_int> **)
                                  (puVar1[1] * uVar55 * 0x18 + puVar1[2] + 0x10 + lVar39),
                                 *(Array2D<float> **)
                                  (puVar2[1] * uVar55 * 0x18 + puVar2[2] + 0x10 + lVar39),
                                 *(Array2D<Imath_3_2::half> **)
                                  (*(ulong *)(local_368 + 8) * uVar55 * 0x18 +
                                   *(ulong *)(local_368 + 0x10) + 0x10 + lVar39),iVar17);
                    }
                    uVar55 = uVar55 + 1;
                  } while (uVar28 != uVar55);
                }
                uVar42 = uVar42 + 1;
              } while (uVar42 != local_330);
            }
          }
          uVar38 = uVar38 + 1;
        } while (uVar38 != local_308);
      }
      pTVar30 = (ThreadPool *)operator_new(0x10);
      pTVar48 = (Task *)0x20;
      IlmThread_3_4::ThreadPool::ThreadPool(pTVar30,0x20);
      IlmThread_3_4::TaskGroup::TaskGroup((TaskGroup *)&local_370);
      uVar44 = (uint)local_250;
      if (0 < (int)uVar44) {
        local_250 = -(ulong)(uVar44 & 0x7fffffff);
        local_330 = -(ulong)(uVar44 - 1);
        uVar38 = 0;
        uVar44 = 0;
        uVar28 = 0;
        pTVar43 = (Task *)0x0;
        pTVar47 = (Task *)0x0;
        pTVar52 = (Task *)0x0;
        local_2f0 = pTVar30;
        do {
          pWVar51 = (WritingTaskData *)((long)local_218 + uVar38);
          if (pTVar47 == pTVar43) {
            pTVar47 = pTVar43 + -(long)pTVar52;
            if (pTVar47 == (Task *)0x7ffffffffffffff8) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar55 = (long)pTVar47 >> 3;
            uVar42 = 1;
            if (pTVar43 != pTVar52) {
              uVar42 = uVar55;
            }
            this_02 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                       *)(uVar42 + uVar55);
            if ((_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                 *)0xffffffffffffffe < this_02) {
              this_02 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                         *)0xfffffffffffffff;
            }
            if (CARRY8(uVar42,uVar55)) {
              this_02 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                         *)0xfffffffffffffff;
            }
            __dest = (Task *)std::
                             _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                             ::_M_allocate(this_02,(size_t)pTVar48);
            *(WritingTaskData **)(__dest + (long)pTVar47) = pWVar51;
            if (0 < (long)pTVar47) {
              pTVar48 = pTVar52;
              memmove(__dest,pTVar52,(size_t)pTVar47);
            }
            if (pTVar52 != (Task *)0x0) {
              pTVar48 = pTVar47;
              operator_delete(pTVar52,(ulong)pTVar47);
            }
            pTVar47 = pTVar47 + (long)__dest;
            pTVar43 = __dest + (long)this_02 * 8;
          }
          else {
            *(WritingTaskData **)pTVar47 = pWVar51;
            __dest = pTVar52;
          }
          pTVar47 = pTVar47 + 8;
          if (((uVar44 / 10) * -10 == (int)uVar28) || (local_330 == uVar28)) {
            local_368 = (Task *)operator_new(0x38);
            pTVar52 = pTVar47 + -(long)__dest;
            __dest_00 = std::
                        _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                        ::_M_allocate((_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                                       *)((long)pTVar52 >> 3),(size_t)pTVar48);
            local_2e8 = uVar38;
            if (pTVar47 != __dest) {
              memmove(__dest_00,__dest,(size_t)pTVar52);
            }
            pTVar48 = local_368;
            local_300 = local_2d8._data;
            __n = (TaskGroup *)&local_370;
            IlmThread_3_4::Task::Task(local_368,__n);
            *(undefined ***)pTVar48 = &PTR__WritingTask_001e8268;
            *(Array2D<unsigned_int> **)(pTVar48 + 0x10) = &local_358;
            *(undefined8 *)(pTVar48 + 0x18) = 0;
            *(undefined8 *)(pTVar48 + 0x20) = 0;
            *(undefined8 *)(pTVar48 + 0x28) = 0;
            __dest_01 = std::
                        _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                        ::_M_allocate((_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                                       *)((long)pTVar52 >> 3),(size_t)__n);
            *(pointer *)(pTVar48 + 0x18) = __dest_01;
            *(pointer *)(pTVar48 + 0x20) = __dest_01;
            *(Task **)(pTVar48 + 0x28) = (Task *)((long)__dest_01 + (long)pTVar52);
            if (pTVar47 != __dest) {
              memcpy(__dest_01,__dest_00,(size_t)pTVar52);
            }
            *(Task **)(pTVar48 + 0x20) = (Task *)((long)__dest_01 + (long)pTVar52);
            *(Array2D<Imf_3_4::FrameBuffer> **)(pTVar48 + 0x30) = local_300;
            IlmThread_3_4::ThreadPool::addTask((Task *)local_2f0);
            uVar38 = local_2e8;
            pTVar47 = __dest;
            if (__dest_00 != (pointer)0x0) {
              operator_delete(__dest_00,(ulong)pTVar52);
              pTVar48 = pTVar52;
            }
          }
          pTVar30 = local_2f0;
          uVar28 = uVar28 - 1;
          uVar44 = uVar44 + 1;
          uVar38 = uVar38 + 0x14;
          pTVar52 = __dest;
        } while (local_250 != uVar28);
        if (__dest != (Task *)0x0) {
          operator_delete(__dest,(long)pTVar43 - (long)__dest);
        }
      }
      IlmThread_3_4::TaskGroup::~TaskGroup((TaskGroup *)&local_370);
      uVar38 = local_308;
      if (0 < (int)local_35c) {
        uVar28 = 0;
        do {
          operator_delete(*(void **)((long)local_1b8 + uVar28 * 8),8);
          uVar28 = uVar28 + 1;
        } while (uVar38 != uVar28);
      }
      (**(code **)(*(long *)pTVar30 + 8))(pTVar30);
      sVar41 = *local_1e8;
      psVar49 = local_1e8;
      if (sVar41 != 0) {
        psVar53 = local_1e8 + sVar41 * 3 + 1;
        do {
          sVar7 = psVar53[-1];
          if (sVar7 != 0) {
            lVar26 = *(long *)(sVar7 - 8);
            if (lVar26 != 0) {
              lVar39 = lVar26 * 0x18;
              do {
                pvVar37 = *(void **)((long)(sVar7 - 8) + lVar39);
                if (pvVar37 != (void *)0x0) {
                  operator_delete__(pvVar37);
                }
                lVar39 = lVar39 + -0x18;
              } while (lVar39 != 0);
            }
            operator_delete__((void *)(sVar7 - 8),lVar26 * 0x18 + 8);
            psVar49 = local_1e8;
          }
          psVar53 = psVar53 + -3;
        } while (psVar53 != local_1e0);
      }
      operator_delete__(psVar49,sVar41 * 0x18 + 8);
      sVar41 = *local_1f8;
      psVar49 = local_1f8;
      if (sVar41 != 0) {
        psVar53 = local_1f8 + sVar41 * 3 + 1;
        do {
          sVar7 = psVar53[-1];
          if (sVar7 != 0) {
            lVar26 = *(long *)(sVar7 - 8);
            if (lVar26 != 0) {
              lVar39 = lVar26 * 0x18;
              do {
                pvVar37 = *(void **)((long)(sVar7 - 8) + lVar39);
                if (pvVar37 != (void *)0x0) {
                  operator_delete__(pvVar37);
                }
                lVar39 = lVar39 + -0x18;
              } while (lVar39 != 0);
            }
            operator_delete__((void *)(sVar7 - 8),lVar26 * 0x18 + 8);
            psVar49 = local_1f8;
          }
          psVar53 = psVar53 + -3;
        } while (psVar53 != local_1d0);
      }
      operator_delete__(psVar49,sVar41 * 0x18 + 8);
      sVar41 = *local_1f0;
      psVar49 = local_1f0;
      if (sVar41 != 0) {
        psVar53 = local_1f0 + sVar41 * 3 + 1;
        do {
          sVar7 = psVar53[-1];
          if (sVar7 != 0) {
            lVar26 = *(long *)(sVar7 - 8);
            if (lVar26 != 0) {
              lVar39 = lVar26 * 0x18;
              do {
                pvVar37 = *(void **)((long)(sVar7 - 8) + lVar39);
                if (pvVar37 != (void *)0x0) {
                  operator_delete__(pvVar37);
                }
                lVar39 = lVar39 + -0x18;
              } while (lVar39 != 0);
            }
            operator_delete__((void *)(sVar7 - 8),lVar26 * 0x18 + 8);
            psVar49 = local_1f0;
          }
          psVar53 = psVar53 + -3;
        } while (psVar53 != local_1d8);
      }
      operator_delete__(psVar49,sVar41 * 0x18 + 8);
      Imf_3_4::Array<Imf_3_4::Array2D<Imf_3_4::FrameBuffer>_>::~Array(&local_2d8);
      std::vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>::~vector(&local_288);
      if (local_1b8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1b8,(long)local_1a8 - (long)local_1b8);
      }
      Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile((MultiPartOutputFile *)&local_358);
      if (local_218 != (void *)0x0) {
        operator_delete(local_218,local_208 - (long)local_218);
      }
      if ((Array2D<unsigned_int> *)local_328._data != (Array2D<unsigned_int> *)0x0) {
        operator_delete__(local_328._data);
      }
      if ((Array2D<float> *)local_2c8._data != (Array2D<float> *)0x0) {
        operator_delete__(local_2c8._data);
      }
      if ((Array2D<Imath_3_2::half> *)local_2a8._data != (Array2D<Imath_3_2::half> *)0x0) {
        operator_delete__(local_2a8._data);
      }
      plVar50 = local_248[0];
      local_358._data = (uint *)0x0;
      local_358._sizeX = 0;
      local_358._sizeY = 0;
      local_2a8._data = (half *)0x0;
      local_2a8._sizeX = 0;
      local_2a8._sizeY = 0;
      local_2c8._data = (half *)0x0;
      local_2c8._sizeX = 0;
      local_2c8._sizeY = 0;
      iVar16 = Imf_3_4::globalThreadCount();
      uVar38 = 1;
      Imf_3_4::MultiPartInputFile::MultiPartInputFile
                ((MultiPartInputFile *)&local_288,(char *)plVar50,iVar16,true);
      uVar28 = 0;
      while( true ) {
        uVar19 = (undefined4)uVar38;
        iVar16 = Imf_3_4::MultiPartInputFile::parts();
        if ((ulong)(long)iVar16 <= uVar28) break;
        Imf_3_4::MultiPartInputFile::header((int)&local_288);
        puVar31 = (undefined8 *)Imf_3_4::Header::displayWindow();
        puVar32 = (undefined8 *)Imf_3_4::Header::displayWindow();
        iVar16 = -(uint)((int)*puVar32 == (int)*puVar31);
        iVar17 = -(uint)((int)((ulong)*puVar32 >> 0x20) == (int)((ulong)*puVar31 >> 0x20));
        auVar56._4_4_ = iVar16;
        auVar56._0_4_ = iVar16;
        auVar56._8_4_ = iVar17;
        auVar56._12_4_ = iVar17;
        iVar16 = movmskpd(uVar19,auVar56);
        if ((iVar16 != 3) ||
           (iVar17 = -(uint)((int)puVar32[1] == (int)puVar31[1]),
           iVar18 = -(uint)((int)((ulong)puVar32[1] >> 0x20) == (int)((ulong)puVar31[1] >> 0x20)),
           auVar57._4_4_ = iVar17, auVar57._0_4_ = iVar17, auVar57._8_4_ = iVar18,
           auVar57._12_4_ = iVar18, iVar17 = movmskpd((int)puVar32,auVar57), iVar17 != 3)) {
          __assert_fail("header.displayWindow () == headers[i].displayWindow ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x297,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        puVar31 = (undefined8 *)Imf_3_4::Header::dataWindow();
        puVar32 = (undefined8 *)Imf_3_4::Header::dataWindow();
        iVar17 = -(uint)((int)*puVar32 == (int)*puVar31);
        iVar18 = -(uint)((int)((ulong)*puVar32 >> 0x20) == (int)((ulong)*puVar31 >> 0x20));
        auVar58._4_4_ = iVar17;
        auVar58._0_4_ = iVar17;
        auVar58._8_4_ = iVar18;
        auVar58._12_4_ = iVar18;
        uVar44 = movmskpd(iVar16,auVar58);
        uVar38 = (ulong)uVar44;
        if ((uVar44 != 3) ||
           (iVar16 = -(uint)((int)puVar32[1] == (int)puVar31[1]),
           iVar17 = -(uint)((int)((ulong)puVar32[1] >> 0x20) == (int)((ulong)puVar31[1] >> 0x20)),
           auVar59._4_4_ = iVar16, auVar59._0_4_ = iVar16, auVar59._8_4_ = iVar17,
           auVar59._12_4_ = iVar17, iVar16 = movmskpd((int)puVar32,auVar59), iVar16 != 3)) {
          __assert_fail("header.dataWindow () == headers[i].dataWindow ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x298,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        pfVar33 = (float *)Imf_3_4::Header::pixelAspectRatio();
        fVar3 = *pfVar33;
        pfVar33 = (float *)Imf_3_4::Header::pixelAspectRatio();
        if ((fVar3 != *pfVar33) || (NAN(fVar3) || NAN(*pfVar33))) {
          __assert_fail("header.pixelAspectRatio () == headers[i].pixelAspectRatio ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x299,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        pfVar33 = (float *)Imf_3_4::Header::screenWindowCenter();
        pfVar34 = (float *)Imf_3_4::Header::screenWindowCenter();
        if ((((*pfVar33 != *pfVar34) || (NAN(*pfVar33) || NAN(*pfVar34))) ||
            (pfVar33[1] != pfVar34[1])) || (NAN(pfVar33[1]) || NAN(pfVar34[1]))) {
          __assert_fail("header.screenWindowCenter () == headers[i].screenWindowCenter ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x29b,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        pfVar33 = (float *)Imf_3_4::Header::screenWindowWidth();
        fVar3 = *pfVar33;
        pfVar33 = (float *)Imf_3_4::Header::screenWindowWidth();
        if ((fVar3 != *pfVar33) || (NAN(fVar3) || NAN(*pfVar33))) {
          __assert_fail("header.screenWindowWidth () == headers[i].screenWindowWidth ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x29c,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        piVar35 = (int *)Imf_3_4::Header::lineOrder();
        iVar16 = *piVar35;
        piVar35 = (int *)Imf_3_4::Header::lineOrder();
        if (iVar16 != *piVar35) {
          __assert_fail("header.lineOrder () == headers[i].lineOrder ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x29d,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        piVar35 = (int *)Imf_3_4::Header::compression();
        iVar16 = *piVar35;
        piVar35 = (int *)Imf_3_4::Header::compression();
        if (iVar16 != *piVar35) {
          __assert_fail("header.compression () == headers[i].compression ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x29e,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        Imf_3_4::Header::channels();
        lVar26 = Imf_3_4::ChannelList::begin();
        Imf_3_4::Header::channels();
        lVar39 = Imf_3_4::ChannelList::begin();
        local_1b8 = *(undefined1 (*) [8])(lVar26 + 0x120);
        uStack_1b0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar26 + 0x128);
        local_328._sizeX = *(long *)(lVar39 + 0x120);
        local_328._sizeY = *(long *)(lVar39 + 0x128);
        cVar14 = Imf_3_4::Channel::operator==((Channel *)local_1b8,(Channel *)&local_328);
        if (cVar14 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," type ",6);
          poVar23 = (ostream *)std::ostream::operator<<(&std::cout,local_1b8._0_4_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar23,", ",2);
          poVar23 = (ostream *)std::ostream::operator<<(poVar23,(int)local_328._sizeX);
          std::__ostream_insert<char,std::char_traits<char>>(poVar23," xSampling ",0xb);
          poVar23 = (ostream *)std::ostream::operator<<(poVar23,local_1b8._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar23,", ",2);
          poVar23 = (ostream *)std::ostream::operator<<(poVar23,local_328._sizeX._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar23," ySampling ",0xb);
          poVar23 = (ostream *)std::ostream::operator<<(poVar23,(_Rb_tree_color)uStack_1b0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar23,", ",2);
          poVar23 = (ostream *)std::ostream::operator<<(poVar23,(int)local_328._sizeY);
          std::__ostream_insert<char,std::char_traits<char>>(poVar23," pLinear ",9);
          poVar23 = std::ostream::_M_insert<bool>(SUB81(poVar23,0));
          std::__ostream_insert<char,std::char_traits<char>>(poVar23,", ",2);
          std::ostream::_M_insert<bool>(SUB81(poVar23,0));
          std::ostream::flush();
        }
        this_00 = (ChannelList *)Imf_3_4::Header::channels();
        pCVar36 = (ChannelList *)Imf_3_4::Header::channels();
        cVar14 = Imf_3_4::ChannelList::operator==(this_00,pCVar36);
        if (cVar14 == '\0') {
          __assert_fail("header.channels () == headers[i].channels ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x2af,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        puVar31 = (undefined8 *)Imf_3_4::Header::name_abi_cxx11_();
        puVar32 = (undefined8 *)Imf_3_4::Header::name_abi_cxx11_();
        sVar8 = puVar31[1];
        if ((sVar8 != puVar32[1]) ||
           ((sVar8 != 0 && (iVar16 = bcmp((void *)*puVar31,(void *)*puVar32,sVar8), iVar16 != 0))))
        {
          __assert_fail("header.name () == headers[i].name ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x2b0,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        puVar31 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
        puVar32 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
        sVar8 = puVar31[1];
        if ((sVar8 != puVar32[1]) ||
           ((sVar8 != 0 && (iVar16 = bcmp((void *)*puVar31,(void *)*puVar32,sVar8), iVar16 != 0))))
        {
          __assert_fail("header.type () == headers[i].type ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x2b1,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        uVar28 = uVar28 + 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Reading whole files ",0x14);
      std::ostream::flush();
      local_328._sizeX = 0;
      local_328._sizeY = 0;
      local_328._data = (uint *)0x0;
      uVar38 = ((long)DAT_001ebd30 - (long)(anonymous_namespace)::headers >> 3) * 0x6db6db6db6db6db7
      ;
      local_1b8 = (undefined1  [8])((ulong)local_1b8 & 0xffffffff00000000);
      uVar44 = (uint)uVar38;
      if (0 < (int)uVar44) {
        iVar16 = 0;
        do {
          if ((uint *)local_328._sizeY == local_328._data) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_328,(iterator)local_328._sizeY,
                       (int *)local_1b8);
          }
          else {
            *(int *)local_328._sizeY = iVar16;
            local_328._sizeY = local_328._sizeY + 4;
          }
          iVar16 = local_1b8._0_4_ + 1;
          local_1b8._0_4_ = iVar16;
        } while (iVar16 < (int)uVar44);
        uVar38 = uVar38 & 0xffffffff;
        do {
          iVar16 = random_int(uVar44);
          iVar17 = random_int(uVar44);
          uVar19 = *(undefined4 *)(local_328._sizeX + (long)iVar16 * 4);
          *(undefined4 *)(local_328._sizeX + (long)iVar16 * 4) =
               *(undefined4 *)(local_328._sizeX + (long)iVar17 * 4);
          *(undefined4 *)(local_328._sizeX + (long)iVar17 * 4) = uVar19;
          uVar45 = (int)uVar38 - 1;
          uVar38 = (ulong)uVar45;
        } while (uVar45 != 0);
        uVar38 = 0;
        do {
          iVar16 = *(int *)(local_328._sizeX + uVar38 * 4);
          lVar26 = (long)iVar16;
          iVar17 = (int)(TiledInputPart *)&local_218;
          if (*(int *)((anonymous_namespace)::partTypes + lVar26 * 4) == 0) {
            uStack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         ((ulong)uStack_1b0._4_4_ << 0x20);
            local_1a8 = (_Base_ptr)0x0;
            local_1a0 = (_Base_ptr)&uStack_1b0;
            local_190 = 0;
            local_198 = local_1a0;
            setInputFrameBuffer((FrameBuffer *)local_1b8,
                                *(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4),&local_358,
                                (Array2D<float> *)&local_2a8,&local_2c8,0xc5,0x107);
            Imf_3_4::InputPart::InputPart
                      ((InputPart *)&local_218,(MultiPartInputFile *)&local_288,iVar16);
            Imf_3_4::InputPart::setFrameBuffer((FrameBuffer *)&local_218);
            Imf_3_4::InputPart::readPixels(iVar17,0);
            iVar16 = *(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4);
            if (iVar16 == 0) {
              bVar15 = checkPixels<unsigned_int>(&local_358,0,0xc4,0,0x106,0xc5);
              if (!bVar15) {
                __assert_fail("checkPixels<unsigned int> (uData, width, height)",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                              ,0x2e1,
                              "void (anonymous namespace)::readWholeFiles(const std::string &)");
              }
            }
            else if (iVar16 == 1) {
              bVar15 = checkPixels<float>((Array2D<float> *)&local_2a8,0,0xc4,0,0x106,0xc5);
              if (!bVar15) {
                __assert_fail("checkPixels<float> (fData, width, height)",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                              ,0x2e4,
                              "void (anonymous namespace)::readWholeFiles(const std::string &)");
              }
            }
            else if ((iVar16 == 2) &&
                    (bVar15 = checkPixels<Imath_3_2::half>(&local_2c8,0,0xc4,0,0x106,0xc5), !bVar15)
                    ) {
              __assert_fail("checkPixels<half> (hData, width, height)",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                            ,0x2e7,"void (anonymous namespace)::readWholeFiles(const std::string &)"
                           );
            }
          }
          else {
            uStack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         ((ulong)uStack_1b0._4_4_ << 0x20);
            local_1a8 = (_Base_ptr)0x0;
            local_1a0 = (_Base_ptr)&uStack_1b0;
            local_190 = 0;
            local_198 = local_1a0;
            Imf_3_4::TiledInputPart::TiledInputPart
                      ((TiledInputPart *)&local_218,(MultiPartInputFile *)&local_288,iVar16);
            iVar16 = Imf_3_4::TiledInputPart::numXLevels();
            iVar18 = Imf_3_4::TiledInputPart::numYLevels();
            if (0 < iVar16) {
              iVar54 = 0;
              do {
                if (0 < iVar18) {
                  iVar46 = 0;
                  do {
                    cVar14 = Imf_3_4::TiledInputPart::isValidLevel(iVar17,iVar54);
                    if (cVar14 != '\0') {
                      width = Imf_3_4::TiledInputPart::levelWidth(iVar17);
                      iVar20 = Imf_3_4::TiledInputPart::levelHeight(iVar17);
                      setInputFrameBuffer((FrameBuffer *)local_1b8,
                                          *(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4),
                                          &local_358,(Array2D<float> *)&local_2a8,&local_2c8,0xc5,
                                          0x107);
                      Imf_3_4::TiledInputPart::setFrameBuffer((FrameBuffer *)&local_218);
                      iVar21 = Imf_3_4::TiledInputPart::numXTiles(iVar17);
                      iVar22 = Imf_3_4::TiledInputPart::numYTiles(iVar17);
                      Imf_3_4::TiledInputPart::readTiles(iVar17,0,iVar21 + -1,0,iVar22 + -1,iVar54);
                      iVar21 = *(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4);
                      if (iVar21 == 0) {
                        bVar15 = checkPixels<unsigned_int>
                                           (&local_358,0,width + -1,0,iVar20 + -1,width);
                        if (!bVar15) {
                          __assert_fail("checkPixels<unsigned int> (uData, w, h)",
                                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                                        ,0x30b,
                                        "void (anonymous namespace)::readWholeFiles(const std::string &)"
                                       );
                        }
                      }
                      else if (iVar21 == 1) {
                        bVar15 = checkPixels<float>((Array2D<float> *)&local_2a8,0,width + -1,0,
                                                    iVar20 + -1,width);
                        if (!bVar15) {
                          __assert_fail("checkPixels<float> (fData, w, h)",
                                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                                        ,0x30e,
                                        "void (anonymous namespace)::readWholeFiles(const std::string &)"
                                       );
                        }
                      }
                      else if ((iVar21 == 2) &&
                              (bVar15 = checkPixels<Imath_3_2::half>
                                                  (&local_2c8,0,width + -1,0,iVar20 + -1,width),
                              !bVar15)) {
                        __assert_fail("checkPixels<half> (hData, w, h)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                                      ,0x311,
                                      "void (anonymous namespace)::readWholeFiles(const std::string &)"
                                     );
                      }
                    }
                    iVar46 = iVar46 + 1;
                  } while (iVar18 != iVar46);
                }
                iVar54 = iVar54 + 1;
              } while (iVar54 != iVar16);
            }
          }
          std::
          _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                       *)local_1b8);
          uVar38 = uVar38 + 1;
        } while (uVar38 != (uVar44 & 0x7fffffff));
        if ((void *)local_328._sizeX != (void *)0x0) {
          operator_delete((void *)local_328._sizeX,(long)local_328._data - local_328._sizeX);
        }
      }
      if (local_270 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_270);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_288.super__Vector_base<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_288.
                   super__Vector_base<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
      }
      if (local_2c8._data != (half *)0x0) {
        operator_delete__(local_2c8._data);
      }
      if (local_2a8._data != (half *)0x0) {
        operator_delete__(local_2a8._data);
      }
      if (local_358._data != (uint *)0x0) {
        operator_delete__(local_358._data);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Reading partial files ",0x16);
      std::ostream::flush();
      plVar50 = local_248[0];
      iVar16 = Imf_3_4::globalThreadCount();
      Imf_3_4::MultiPartInputFile::MultiPartInputFile
                ((MultiPartInputFile *)local_1b8,(char *)plVar50,iVar16,true);
      IlmThread_3_4::TaskGroup::TaskGroup((TaskGroup *)&local_288);
      pTVar30 = (ThreadPool *)operator_new(0x10);
      IlmThread_3_4::ThreadPool::ThreadPool(pTVar30,0x20);
      iVar16 = local_220;
      if (0 < local_220) {
        do {
          pTVar48 = (Task *)operator_new(0x18);
          IlmThread_3_4::Task::Task(pTVar48,(TaskGroup *)&local_288);
          *(undefined ***)pTVar48 = &PTR__Task_001e82a8;
          *(undefined1 **)(pTVar48 + 0x10) = local_1b8;
          IlmThread_3_4::ThreadPool::addTask((Task *)pTVar30);
          iVar16 = iVar16 + -1;
        } while (iVar16 != 0);
      }
      (**(code **)(*(long *)pTVar30 + 8))(pTVar30);
      IlmThread_3_4::TaskGroup::~TaskGroup((TaskGroup *)&local_288);
      if (local_1a0 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0);
      }
      if (uStack_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(uStack_1b0);
      }
      remove((char *)local_248[0]);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      iVar16 = local_21c;
      std::ostream::put(-0x60);
      std::ostream::flush();
      std::ostream::flush();
      iVar16 = iVar16 + 1;
    } while (iVar16 != local_224);
  }
  if (local_248[0] != local_238) {
    operator_delete(local_248[0],local_238[0] + 1);
  }
  return;
}

Assistant:

void
testWriteRead (
    int                partNumber,
    int                runCount,
    int                randomReadCount,
    const std::string& tempDir)
{
    cout << "Testing file with " << partNumber << " part(s)." << endl << flush;

    std::string fn = tempDir + "imf_test_multipart_mixing_basic.exr";

    for (int i = 0; i < runCount; i++)
    {
        generateRandomFile (partNumber, fn);
        readWholeFiles (fn);
        readFirstPart (fn);
        readPartialFiles (randomReadCount, fn);
        killOffsetTables (fn);
        readFirstPart (fn);
        readWholeFiles (fn);

        remove (fn.c_str ());
        cout << endl << flush;
    }
}